

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpSocket.cpp
# Opt level: O0

bool mognetwork::deleteAll(Data *elem)

{
  void *in_RDI;
  vector<char,_std::allocator<char>_> *unaff_retaddr;
  
  if (in_RDI != (void *)0x0) {
    std::vector<char,_std::allocator<char>_>::~vector(unaff_retaddr);
    operator_delete(in_RDI);
  }
  return true;
}

Assistant:

bool deleteAll(TcpSocket::Data* elem) {delete elem; return true;}